

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O1

Result __thiscall
wabt::BinaryReaderLogging::OnLocalDecl
          (BinaryReaderLogging *this,Index decl_index,Index count,Type type)

{
  Stream *this_00;
  Enum EVar1;
  Type local_58;
  string local_50;
  
  local_58 = type;
  WriteIndent(this);
  this_00 = this->stream_;
  Type::GetName_abi_cxx11_(&local_50,&local_58);
  Stream::Writef(this_00,"OnLocalDecl(index: %u, count: %u, type: %s)\n",decl_index,(ulong)count,
                 local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x36])
                    (this->reader_,decl_index,(ulong)count,local_58);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnLocalDecl(Index decl_index,
                                        Index count,
                                        Type type) {
  LOGF("OnLocalDecl(index: %" PRIindex ", count: %" PRIindex ", type: %s)\n",
       decl_index, count, type.GetName().c_str());
  return reader_->OnLocalDecl(decl_index, count, type);
}